

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe2_LPGCachePolicy.cpp
# Opt level: O0

GMM_STATUS __thiscall GmmLib::GmmXe2_LPGCachePolicy::SetupPAT(GmmXe2_LPGCachePolicy *this)

{
  GMM_PRIVATE_PAT *pGVar1;
  SKU_FEATURE_TABLE *pSVar2;
  uint local_1c;
  uint32_t i;
  GMM_PRIVATE_PAT *pPATTlbElement;
  GmmXe2_LPGCachePolicy *this_local;
  
  pGVar1 = Context::GetPrivatePATTable
                     (*(Context **)
                       ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                               super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                               super_GmmCachePolicyCommon + 8));
  for (local_1c = 0;
      local_1c <
      *(uint32_t *)
       ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x10); local_1c = local_1c + 1)
  {
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffffc | 3;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffff3 | 0xc;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffeff;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0x7ff;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xffffffcf | 0x30;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xffffff3f;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffdff;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffbff;
  }
  pGVar1->Value = pGVar1->Value & 0xfffffffc;
  pGVar1->Value = pGVar1->Value & 0xfffffff3 | 0xc;
  pGVar1->Value = pGVar1->Value & 0xfffffeff;
  pGVar1->Value = pGVar1->Value & 0x7ff;
  pGVar1->Value = pGVar1->Value & 0xffffffcf;
  pGVar1->Value = pGVar1->Value & 0xffffff3f;
  pGVar1->Value = pGVar1->Value & 0xfffffdff;
  pGVar1->Value = pGVar1->Value & 0xfffffbff;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffffc | 2;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffff3 | 0xc;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffeff;
  pGVar1[1].Value = pGVar1[1].Value & 0x7ff;
  pGVar1[1].Value = pGVar1[1].Value & 0xffffffcf;
  pGVar1[1].Value = pGVar1[1].Value & 0xffffff3f;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffdff;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffbff;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffffc | 3;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffff3 | 0xc;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffeff;
  pGVar1[2].Value = pGVar1[2].Value & 0x7ff;
  pGVar1[2].Value = pGVar1[2].Value & 0xffffffcf;
  pGVar1[2].Value = pGVar1[2].Value & 0xffffff3f;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffdff;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffbff;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffffc;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffff3 | 0xc;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffeff;
  pGVar1[3].Value = pGVar1[3].Value & 0x7ff;
  pGVar1[3].Value = pGVar1[3].Value & 0xffffffcf | 0x30;
  pGVar1[3].Value = pGVar1[3].Value & 0xffffff3f;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffdff;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffbff;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffffc | 2;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffff3;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffeff;
  pGVar1[4].Value = pGVar1[4].Value & 0x7ff;
  pGVar1[4].Value = pGVar1[4].Value & 0xffffffcf | 0x30;
  pGVar1[4].Value = pGVar1[4].Value & 0xffffff3f;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffdff;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffbff;
  pGVar1[5].Value = pGVar1[5].Value & 0xfffffffc | 2;
  pGVar1[5].Value = pGVar1[5].Value & 0xfffffff3 | 0xc;
  pGVar1[5].Value = pGVar1[5].Value & 0xfffffeff;
  pGVar1[5].Value = pGVar1[5].Value & 0x7ff;
  pGVar1[5].Value = pGVar1[5].Value & 0xffffffcf | 0x30;
  pGVar1[5].Value = pGVar1[5].Value & 0xffffff3f;
  pGVar1[5].Value = pGVar1[5].Value & 0xfffffdff;
  pGVar1[5].Value = pGVar1[5].Value & 0xfffffbff;
  pGVar1[6].Value = pGVar1[6].Value & 0xfffffffc;
  pGVar1[6].Value = pGVar1[6].Value & 0xfffffff3 | 0xc;
  pGVar1[6].Value = pGVar1[6].Value & 0xfffffeff;
  pGVar1[6].Value = pGVar1[6].Value & 0x7ff;
  pSVar2 = Context::GetSkuTable
                     (*(Context **)
                       ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                               super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                               super_GmmCachePolicyCommon + 8));
  pGVar1[6].Value =
       pGVar1[6].Value & 0xffffffcf | (uint)((*(ushort *)&pSVar2->field_0 >> 8 & 1) != 0) << 4;
  pGVar1[6].Value = pGVar1[6].Value & 0xffffff3f;
  pGVar1[6].Value = pGVar1[6].Value & 0xfffffdff;
  pGVar1[6].Value = pGVar1[6].Value & 0xfffffbff | 0x400;
  pGVar1[7].Value = pGVar1[7].Value & 0xfffffffc | 3;
  pGVar1[7].Value = pGVar1[7].Value & 0xfffffff3;
  pGVar1[7].Value = pGVar1[7].Value & 0xfffffeff;
  pGVar1[7].Value = pGVar1[7].Value & 0x7ff;
  pGVar1[7].Value = pGVar1[7].Value & 0xffffffcf | 0x30;
  pGVar1[7].Value = pGVar1[7].Value & 0xffffff3f;
  pGVar1[7].Value = pGVar1[7].Value & 0xfffffdff;
  pGVar1[7].Value = pGVar1[7].Value & 0xfffffbff;
  pGVar1[8].Value = pGVar1[8].Value & 0xfffffffc;
  pGVar1[8].Value = pGVar1[8].Value & 0xfffffff3;
  pGVar1[8].Value = pGVar1[8].Value & 0xfffffeff;
  pGVar1[8].Value = pGVar1[8].Value & 0x7ff;
  pGVar1[8].Value = pGVar1[8].Value & 0xffffffcf | 0x30;
  pGVar1[8].Value = pGVar1[8].Value & 0xffffff3f;
  pGVar1[8].Value = pGVar1[8].Value & 0xfffffdff;
  pGVar1[8].Value = pGVar1[8].Value & 0xfffffbff;
  pGVar1[9].Value = pGVar1[9].Value & 0xfffffffc;
  pGVar1[9].Value = pGVar1[9].Value & 0xfffffff3 | 0xc;
  pGVar1[9].Value = pGVar1[9].Value & 0xfffffeff;
  pGVar1[9].Value = pGVar1[9].Value & 0x7ff;
  pGVar1[9].Value = pGVar1[9].Value & 0xffffffcf;
  pGVar1[9].Value = pGVar1[9].Value & 0xffffff3f;
  pGVar1[9].Value = pGVar1[9].Value & 0xfffffdff | 0x200;
  pGVar1[9].Value = pGVar1[9].Value & 0xfffffbff;
  pGVar1[10].Value = pGVar1[10].Value & 0xfffffffc;
  pGVar1[10].Value = pGVar1[10].Value & 0xfffffff3;
  pGVar1[10].Value = pGVar1[10].Value & 0xfffffeff;
  pGVar1[10].Value = pGVar1[10].Value & 0x7ff;
  pGVar1[10].Value = pGVar1[10].Value & 0xffffffcf | 0x30;
  pGVar1[10].Value = pGVar1[10].Value & 0xffffff3f;
  pGVar1[10].Value = pGVar1[10].Value & 0xfffffdff | 0x200;
  pGVar1[10].Value = pGVar1[10].Value & 0xfffffbff;
  pGVar1[0xb].Value = pGVar1[0xb].Value & 0xfffffffc;
  pGVar1[0xb].Value = pGVar1[0xb].Value & 0xfffffff3 | 0xc;
  pGVar1[0xb].Value = pGVar1[0xb].Value & 0xfffffeff;
  pGVar1[0xb].Value = pGVar1[0xb].Value & 0x7ff;
  pSVar2 = Context::GetSkuTable
                     (*(Context **)
                       ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                               super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                               super_GmmCachePolicyCommon + 8));
  pGVar1[0xb].Value =
       pGVar1[0xb].Value & 0xffffffcf | (uint)((*(ushort *)&pSVar2->field_0 >> 8 & 1) != 0) << 4;
  pGVar1[0xb].Value = pGVar1[0xb].Value & 0xffffff3f;
  pGVar1[0xb].Value = pGVar1[0xb].Value & 0xfffffdff | 0x200;
  pGVar1[0xb].Value = pGVar1[0xb].Value & 0xfffffbff | 0x400;
  pGVar1[0xc].Value = pGVar1[0xc].Value & 0xfffffffc;
  pGVar1[0xc].Value = pGVar1[0xc].Value & 0xfffffff3 | 0xc;
  pGVar1[0xc].Value = pGVar1[0xc].Value & 0xfffffeff;
  pGVar1[0xc].Value = pGVar1[0xc].Value & 0x7ff;
  pGVar1[0xc].Value = pGVar1[0xc].Value & 0xffffffcf | 0x30;
  pGVar1[0xc].Value = pGVar1[0xc].Value & 0xffffff3f;
  pGVar1[0xc].Value = pGVar1[0xc].Value & 0xfffffdff | 0x200;
  pGVar1[0xc].Value = pGVar1[0xc].Value & 0xfffffbff;
  pGVar1[0xd].Value = pGVar1[0xd].Value & 0xfffffffc;
  pGVar1[0xd].Value = pGVar1[0xd].Value & 0xfffffff3;
  pGVar1[0xd].Value = pGVar1[0xd].Value & 0xfffffeff;
  pGVar1[0xd].Value = pGVar1[0xd].Value & 0x7ff;
  pGVar1[0xd].Value = pGVar1[0xd].Value & 0xffffffcf;
  pGVar1[0xd].Value = pGVar1[0xd].Value & 0xffffff3f;
  pGVar1[0xd].Value = pGVar1[0xd].Value & 0xfffffdff;
  pGVar1[0xd].Value = pGVar1[0xd].Value & 0xfffffbff;
  pGVar1[0xe].Value = pGVar1[0xe].Value & 0xfffffffc;
  pGVar1[0xe].Value = pGVar1[0xe].Value & 0xfffffff3;
  pGVar1[0xe].Value = pGVar1[0xe].Value & 0xfffffeff;
  pGVar1[0xe].Value = pGVar1[0xe].Value & 0x7ff;
  pGVar1[0xe].Value = pGVar1[0xe].Value & 0xffffffcf;
  pGVar1[0xe].Value = pGVar1[0xe].Value & 0xffffff3f;
  pGVar1[0xe].Value = pGVar1[0xe].Value & 0xfffffdff | 0x200;
  pGVar1[0xe].Value = pGVar1[0xe].Value & 0xfffffbff;
  pGVar1[0xf].Value = pGVar1[0xf].Value & 0xfffffffc;
  pGVar1[0xf].Value = pGVar1[0xf].Value & 0xfffffff3 | 4;
  pGVar1[0xf].Value = pGVar1[0xf].Value & 0xfffffeff;
  pGVar1[0xf].Value = pGVar1[0xf].Value & 0x7ff;
  pSVar2 = Context::GetSkuTable
                     (*(Context **)
                       ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                               super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                               super_GmmCachePolicyCommon + 8));
  pGVar1[0xf].Value =
       pGVar1[0xf].Value & 0xffffffcf | (uint)((*(ushort *)&pSVar2->field_0 >> 8 & 1) != 0) << 4;
  pGVar1[0xf].Value = pGVar1[0xf].Value & 0xffffff3f;
  pGVar1[0xf].Value = pGVar1[0xf].Value & 0xfffffdff | 0x200;
  pGVar1[0xf].Value = pGVar1[0xf].Value & 0xfffffbff | 0x400;
  pGVar1[0x14].Value = pGVar1[0x14].Value & 0xfffffffc;
  pGVar1[0x14].Value = pGVar1[0x14].Value & 0xfffffff3 | 0xc;
  pGVar1[0x14].Value = pGVar1[0x14].Value & 0xfffffeff;
  pGVar1[0x14].Value = pGVar1[0x14].Value & 0x7ff;
  pGVar1[0x14].Value = pGVar1[0x14].Value & 0xffffffcf;
  pGVar1[0x14].Value = pGVar1[0x14].Value & 0xffffff3f | 0x40;
  pGVar1[0x14].Value = pGVar1[0x14].Value & 0xfffffdff;
  pGVar1[0x14].Value = pGVar1[0x14].Value & 0xfffffbff;
  pGVar1[0x15].Value = pGVar1[0x15].Value & 0xfffffffc;
  pGVar1[0x15].Value = pGVar1[0x15].Value & 0xfffffff3 | 0xc;
  pGVar1[0x15].Value = pGVar1[0x15].Value & 0xfffffeff;
  pGVar1[0x15].Value = pGVar1[0x15].Value & 0x7ff;
  pGVar1[0x15].Value = pGVar1[0x15].Value & 0xffffffcf;
  pGVar1[0x15].Value = pGVar1[0x15].Value & 0xffffff3f | 0x40;
  pGVar1[0x15].Value = pGVar1[0x15].Value & 0xfffffdff | 0x200;
  pGVar1[0x15].Value = pGVar1[0x15].Value & 0xfffffbff;
  pGVar1[0x16].Value = pGVar1[0x16].Value & 0xfffffffc | 2;
  pGVar1[0x16].Value = pGVar1[0x16].Value & 0xfffffff3 | 0xc;
  pGVar1[0x16].Value = pGVar1[0x16].Value & 0xfffffeff;
  pGVar1[0x16].Value = pGVar1[0x16].Value & 0x7ff;
  pGVar1[0x16].Value = pGVar1[0x16].Value & 0xffffffcf;
  pGVar1[0x16].Value = pGVar1[0x16].Value & 0xffffff3f | 0x40;
  pGVar1[0x16].Value = pGVar1[0x16].Value & 0xfffffdff;
  pGVar1[0x16].Value = pGVar1[0x16].Value & 0xfffffbff;
  pGVar1[0x17].Value = pGVar1[0x17].Value & 0xfffffffc | 3;
  pGVar1[0x17].Value = pGVar1[0x17].Value & 0xfffffff3 | 0xc;
  pGVar1[0x17].Value = pGVar1[0x17].Value & 0xfffffeff;
  pGVar1[0x17].Value = pGVar1[0x17].Value & 0x7ff;
  pGVar1[0x17].Value = pGVar1[0x17].Value & 0xffffffcf;
  pGVar1[0x17].Value = pGVar1[0x17].Value & 0xffffff3f | 0x40;
  pGVar1[0x17].Value = pGVar1[0x17].Value & 0xfffffdff;
  pGVar1[0x17].Value = pGVar1[0x17].Value & 0xfffffbff;
  pGVar1[0x18].Value = pGVar1[0x18].Value & 0xfffffffc;
  pGVar1[0x18].Value = pGVar1[0x18].Value & 0xfffffff3 | 0xc;
  pGVar1[0x18].Value = pGVar1[0x18].Value & 0xfffffeff;
  pGVar1[0x18].Value = pGVar1[0x18].Value & 0x7ff;
  pGVar1[0x18].Value = pGVar1[0x18].Value & 0xffffffcf;
  pGVar1[0x18].Value = pGVar1[0x18].Value & 0xffffff3f | 0x80;
  pGVar1[0x18].Value = pGVar1[0x18].Value & 0xfffffdff;
  pGVar1[0x18].Value = pGVar1[0x18].Value & 0xfffffbff;
  pGVar1[0x19].Value = pGVar1[0x19].Value & 0xfffffffc;
  pGVar1[0x19].Value = pGVar1[0x19].Value & 0xfffffff3 | 0xc;
  pGVar1[0x19].Value = pGVar1[0x19].Value & 0xfffffeff;
  pGVar1[0x19].Value = pGVar1[0x19].Value & 0x7ff;
  pGVar1[0x19].Value = pGVar1[0x19].Value & 0xffffffcf;
  pGVar1[0x19].Value = pGVar1[0x19].Value & 0xffffff3f | 0x80;
  pGVar1[0x19].Value = pGVar1[0x19].Value & 0xfffffdff | 0x200;
  pGVar1[0x19].Value = pGVar1[0x19].Value & 0xfffffbff;
  pGVar1[0x1a].Value = pGVar1[0x1a].Value & 0xfffffffc | 2;
  pGVar1[0x1a].Value = pGVar1[0x1a].Value & 0xfffffff3 | 0xc;
  pGVar1[0x1a].Value = pGVar1[0x1a].Value & 0xfffffeff;
  pGVar1[0x1a].Value = pGVar1[0x1a].Value & 0x7ff;
  pGVar1[0x1a].Value = pGVar1[0x1a].Value & 0xffffffcf;
  pGVar1[0x1a].Value = pGVar1[0x1a].Value & 0xffffff3f | 0x80;
  pGVar1[0x1a].Value = pGVar1[0x1a].Value & 0xfffffdff;
  pGVar1[0x1a].Value = pGVar1[0x1a].Value & 0xfffffbff;
  pGVar1[0x1b].Value = pGVar1[0x1b].Value & 0xfffffffc | 3;
  pGVar1[0x1b].Value = pGVar1[0x1b].Value & 0xfffffff3 | 0xc;
  pGVar1[0x1b].Value = pGVar1[0x1b].Value & 0xfffffeff;
  pGVar1[0x1b].Value = pGVar1[0x1b].Value & 0x7ff;
  pGVar1[0x1b].Value = pGVar1[0x1b].Value & 0xffffffcf;
  pGVar1[0x1b].Value = pGVar1[0x1b].Value & 0xffffff3f | 0x80;
  pGVar1[0x1b].Value = pGVar1[0x1b].Value & 0xfffffdff;
  pGVar1[0x1b].Value = pGVar1[0x1b].Value & 0xfffffbff;
  pGVar1[0x1c].Value = pGVar1[0x1c].Value & 0xfffffffc;
  pGVar1[0x1c].Value = pGVar1[0x1c].Value & 0xfffffff3 | 0xc;
  pGVar1[0x1c].Value = pGVar1[0x1c].Value & 0xfffffeff;
  pGVar1[0x1c].Value = pGVar1[0x1c].Value & 0x7ff;
  pGVar1[0x1c].Value = pGVar1[0x1c].Value & 0xffffffcf;
  pGVar1[0x1c].Value = pGVar1[0x1c].Value & 0xffffff3f | 0xc0;
  pGVar1[0x1c].Value = pGVar1[0x1c].Value & 0xfffffdff;
  pGVar1[0x1c].Value = pGVar1[0x1c].Value & 0xfffffbff;
  pGVar1[0x1d].Value = pGVar1[0x1d].Value & 0xfffffffc;
  pGVar1[0x1d].Value = pGVar1[0x1d].Value & 0xfffffff3 | 0xc;
  pGVar1[0x1d].Value = pGVar1[0x1d].Value & 0xfffffeff;
  pGVar1[0x1d].Value = pGVar1[0x1d].Value & 0x7ff;
  pGVar1[0x1d].Value = pGVar1[0x1d].Value & 0xffffffcf;
  pGVar1[0x1d].Value = pGVar1[0x1d].Value & 0xffffff3f | 0xc0;
  pGVar1[0x1d].Value = pGVar1[0x1d].Value & 0xfffffdff | 0x200;
  pGVar1[0x1d].Value = pGVar1[0x1d].Value & 0xfffffbff;
  pGVar1[0x1e].Value = pGVar1[0x1e].Value & 0xfffffffc | 2;
  pGVar1[0x1e].Value = pGVar1[0x1e].Value & 0xfffffff3 | 0xc;
  pGVar1[0x1e].Value = pGVar1[0x1e].Value & 0xfffffeff;
  pGVar1[0x1e].Value = pGVar1[0x1e].Value & 0x7ff;
  pGVar1[0x1e].Value = pGVar1[0x1e].Value & 0xffffffcf;
  pGVar1[0x1e].Value = pGVar1[0x1e].Value & 0xffffff3f | 0xc0;
  pGVar1[0x1e].Value = pGVar1[0x1e].Value & 0xfffffdff;
  pGVar1[0x1e].Value = pGVar1[0x1e].Value & 0xfffffbff;
  pGVar1[0x1f].Value = pGVar1[0x1f].Value & 0xfffffffc | 3;
  pGVar1[0x1f].Value = pGVar1[0x1f].Value & 0xfffffff3 | 0xc;
  pGVar1[0x1f].Value = pGVar1[0x1f].Value & 0xfffffeff;
  pGVar1[0x1f].Value = pGVar1[0x1f].Value & 0x7ff;
  pGVar1[0x1f].Value = pGVar1[0x1f].Value & 0xffffffcf;
  pGVar1[0x1f].Value = pGVar1[0x1f].Value & 0xffffff3f | 0xc0;
  pGVar1[0x1f].Value = pGVar1[0x1f].Value & 0xfffffdff;
  pGVar1[0x1f].Value = pGVar1[0x1f].Value & 0xfffffbff;
  *(undefined4 *)
   &(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
    field_0x2c = 0x1f;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmXe2_LPGCachePolicy::SetupPAT()
{
    GMM_PRIVATE_PAT *pPATTlbElement = &(pGmmLibContext->GetPrivatePATTable()[0]);

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define L3_WB (0x0)
#define L3_XD (pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush ? 0x1 : 0x0)
#define L3_UC (0x3)
#define L3_XA (0x2) // WB Transient App

#define GMM_DEFINE_PAT_ELEMENT(indx, Coh, L4Caching, L3Caching, L3ClassOfService, CompressionEn, NoCachePromote) \
    {                                                                                                            \
        pPATTlbElement[indx].Xe2.Coherency             = Coh;                                                    \
        pPATTlbElement[indx].Xe2.L4CC                  = L4Caching;                                              \
        pPATTlbElement[indx].Xe2.Reserved1             = 0;                                                      \
        pPATTlbElement[indx].Xe2.Reserved2             = 0;                                                      \
        pPATTlbElement[indx].Xe2.L3CC                  = L3Caching;                                              \
        pPATTlbElement[indx].Xe2.L3CLOS                = L3ClassOfService;                                       \
        pPATTlbElement[indx].Xe2.LosslessCompressionEn = CompressionEn;                                          \
        pPATTlbElement[indx].Xe2.NoCachingPromote      = NoCachePromote;                                         \
    }

    // clang-format off

    // Default PAT Table
    // 32 nos
    for (uint32_t i = 0; i < (NumPATRegisters); i++)
    {   //                      Index  Coherency  CachingPolicy  L3Caching  L3ClassOfService  CompressionEn  NoCachingPromote
        GMM_DEFINE_PAT_ELEMENT( i,     3,         L4_UC,         L3_UC,     0,                0,             0);
    }

    // Fixed PAT Table
    //                      Index  Coherency  L4 CachingPolicy   L3 CachingPolicy   L3 CLOS      CompressionEn   NoCachingPromote
    //Group: GGT/PPGTT[4]
    GMM_DEFINE_PAT_ELEMENT( 0      , 0      , L4_UC              , L3_WB           , 0          , 0             , 0)    //          | L3_WB 
    GMM_DEFINE_PAT_ELEMENT( 1      , 2      , L4_UC              , L3_WB           , 0          , 0             , 0)    //          | L3_WB | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 2      , 3      , L4_UC              , L3_WB           , 0          , 0             , 0)    //          | L3_WB | 2 way coherent
    GMM_DEFINE_PAT_ELEMENT( 3      , 0      , L4_UC              , L3_UC           , 0          , 0             , 0)    // **UC   
    //Group: 1 way Coh
    GMM_DEFINE_PAT_ELEMENT( 4      , 2      , L4_WB              , L3_UC           , 0          , 0             , 0)    // L4_WB            | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 5      , 2      , L4_UC              , L3_UC           , 0          , 0             , 0)    // **UC             | 1 way coherent
    //Group: Compression Disabled
    GMM_DEFINE_PAT_ELEMENT( 6      , 0      , L4_UC              , L3_XD           , 0          , 0             , 1)    //          | L3_XD 
    GMM_DEFINE_PAT_ELEMENT( 7      , 3      , L4_WB              , L3_UC           , 0          , 0             , 0)    // L4_WB            | 2 way coherent
    GMM_DEFINE_PAT_ELEMENT( 8      , 0      , L4_WB              , L3_UC           , 0          , 0             , 0)    // L4_WB  
    //Group: Compression Enabled
    GMM_DEFINE_PAT_ELEMENT( 9      , 0      , L4_UC              , L3_WB           , 0          , 1             , 0)    //          | L3_WB | Comp 
    GMM_DEFINE_PAT_ELEMENT( 10     , 0      , L4_WB              , L3_UC           , 0          , 1             , 0)    // L4_WB            | Comp
    GMM_DEFINE_PAT_ELEMENT( 11     , 0      , L4_UC              , L3_XD           , 0          , 1             , 1)    //          | L3_XD | Comp 
    GMM_DEFINE_PAT_ELEMENT( 12     , 0      , L4_UC              , L3_UC           , 0          , 1             , 0)    // **UC             | Comp 

    GMM_DEFINE_PAT_ELEMENT( 13     , 0      , L4_WB              , L3_WB           , 0          , 0             , 0)     // L4_WB    | L3_WB 
    GMM_DEFINE_PAT_ELEMENT( 14     , 0      , L4_WB              , L3_WB           , 0          , 1             , 0)    // L4_WB    | L3_WB | Comp
    GMM_DEFINE_PAT_ELEMENT( 15     , 0      , L4_WT              , L3_XD           , 0          , 1             , 1)    // L4_WT    | L3_XD | Comp 
    
    //Reserved 16-19
    //Group: CLOS1
    GMM_DEFINE_PAT_ELEMENT( 20      , 0      , L4_UC             , L3_WB           , 1          , 0             , 0)    //          | L3_WB   
    GMM_DEFINE_PAT_ELEMENT( 21      , 0      , L4_UC             , L3_WB           , 1          , 1             , 0)    //          | L3_WB | Comp 
    GMM_DEFINE_PAT_ELEMENT( 22      , 2      , L4_UC             , L3_WB           , 1          , 0             , 0)    //          | L3_WB | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 23      , 3      , L4_UC             , L3_WB           , 1          , 0             , 0)    //          | L3_WB | 2 way coherent 
    //Group:CLOS2=>Clone of CLOS1
    GMM_DEFINE_PAT_ELEMENT( 24      , 0      , L4_UC             , L3_WB           , 2          , 0             , 0)    //          | L3_WB   
    GMM_DEFINE_PAT_ELEMENT( 25      , 0      , L4_UC             , L3_WB           , 2          , 1             , 0)    //          | L3_WB | Comp 
    GMM_DEFINE_PAT_ELEMENT( 26      , 2      , L4_UC             , L3_WB           , 2          , 0             , 0)    //          | L3_WB | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 27      , 3      , L4_UC             , L3_WB           , 2          , 0             , 0)    //          | L3_WB | 2 way coherent 
    //Group:CLOS3=>Clone of CLOS1
    GMM_DEFINE_PAT_ELEMENT( 28      , 0      , L4_UC             , L3_WB           , 3          , 0             , 0)    //          | L3_WB    
    GMM_DEFINE_PAT_ELEMENT( 29      , 0      , L4_UC             , L3_WB           , 3          , 1             , 0)    //          | L3_WB | Comp 
    GMM_DEFINE_PAT_ELEMENT( 30      , 2      , L4_UC             , L3_WB           , 3          , 0             , 0)    //          | L3_WB | 1 way coherent
    GMM_DEFINE_PAT_ELEMENT( 31      , 3      , L4_UC             , L3_WB           , 3          , 0             , 0)    //          | L3_WB | 2 way coherent 

    CurrentMaxPATIndex = 31;

// clang-format on
#undef GMM_DEFINE_PAT
#undef L4_WB
#undef L4_WT
#undef L4_UC

#undef L3_WB
#undef L3_XD
#undef L3_UC
    return GMM_SUCCESS;
}